

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextDescendant(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNodePtr local_20;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    return (xmlNodePtr)0x0;
  }
  if (cur == (xmlNodePtr)0x0) {
    if (ctxt->context->node == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    if ((ctxt->context->node->type != XML_ATTRIBUTE_NODE) &&
       (ctxt->context->node->type != XML_NAMESPACE_DECL)) {
      if ((xmlDocPtr)ctxt->context->node == ctxt->context->doc) {
        return ctxt->context->doc->children;
      }
      return ctxt->context->node->children;
    }
    return (xmlNodePtr)0x0;
  }
  if (cur->type == XML_NAMESPACE_DECL) {
    return (xmlNodePtr)0x0;
  }
  local_20 = cur;
  if (((cur->children != (_xmlNode *)0x0) && (cur->children->type != XML_ENTITY_DECL)) &&
     (local_20 = cur->children, local_20->type != XML_DTD_NODE)) {
    return local_20;
  }
  if (local_20 == ctxt->context->node) {
    return (xmlNodePtr)0x0;
  }
  while (local_20->next != (_xmlNode *)0x0) {
    local_20 = local_20->next;
    if ((local_20->type != XML_ENTITY_DECL) && (local_20->type != XML_DTD_NODE)) {
      return local_20;
    }
  }
  do {
    local_20 = local_20->parent;
    if (local_20 == (_xmlNode *)0x0) {
      return (xmlNodePtr)0x0;
    }
    if (local_20 == ctxt->context->node) {
      return (xmlNodePtr)0x0;
    }
    if (local_20->next != (_xmlNode *)0x0) {
      return local_20->next;
    }
  } while (local_20 != (_xmlNode *)0x0);
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextDescendant(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
	if (ctxt->context->node == NULL)
	    return(NULL);
	if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
	    (ctxt->context->node->type == XML_NAMESPACE_DECL))
	    return(NULL);

        if (ctxt->context->node == (xmlNodePtr) ctxt->context->doc)
	    return(ctxt->context->doc->children);
        return(ctxt->context->node->children);
    }

    if (cur->type == XML_NAMESPACE_DECL)
        return(NULL);
    if (cur->children != NULL) {
	/*
	 * Do not descend on entities declarations
	 */
	if (cur->children->type != XML_ENTITY_DECL) {
	    cur = cur->children;
	    /*
	     * Skip DTDs
	     */
	    if (cur->type != XML_DTD_NODE)
		return(cur);
	}
    }

    if (cur == ctxt->context->node) return(NULL);

    while (cur->next != NULL) {
	cur = cur->next;
	if ((cur->type != XML_ENTITY_DECL) &&
	    (cur->type != XML_DTD_NODE))
	    return(cur);
    }

    do {
        cur = cur->parent;
	if (cur == NULL) break;
	if (cur == ctxt->context->node) return(NULL);
	if (cur->next != NULL) {
	    cur = cur->next;
	    return(cur);
	}
    } while (cur != NULL);
    return(cur);
}